

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthSwapAdjacentVars2(uint *pIn,uint *pOut,int nVars,int Start)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint *puVar10;
  int iVar11;
  uint *puVar12;
  uint *puVar13;
  ulong uVar14;
  uint *puVar15;
  uint *puVar16;
  
  uVar7 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar7 = 1;
  }
  if (nVars + -1 <= Start) {
    __assert_fail("Start < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0xb0,
                  "void Extra_TruthSwapAdjacentVars2(unsigned int *, unsigned int *, int, int)");
  }
  switch(Start) {
  case 0:
    uVar14 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar14;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      uVar7 = pIn[uVar14];
      pOut[uVar14] = uVar7 >> 1 & 0x22222222 | (uVar7 & 0x99999999) + (uVar7 & 0x22222222) * 2;
    }
    break;
  case 1:
    uVar14 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar14;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      uVar7 = pIn[uVar14];
      pOut[uVar14] = uVar7 >> 2 & 0xc0c0c0c | (uVar7 & 0xc3c3c3c3) + (uVar7 & 0xc0c0c0c) * 4;
    }
    break;
  case 2:
    uVar14 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar14;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      uVar7 = pIn[uVar14];
      pOut[uVar14] = uVar7 >> 4 & 0xf000f0 | (uVar7 & 0xf000f0) << 4 | uVar7 & 0xf00ff00f;
    }
    break;
  case 3:
    uVar14 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar14;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      uVar7 = pIn[uVar14];
      pOut[uVar14] = uVar7 >> 8 & 0xff00 | (uVar7 & 0xff00) << 8 | uVar7 & 0xff0000ff;
    }
    break;
  case 4:
    for (lVar3 = 0; lVar3 < (int)uVar7; lVar3 = lVar3 + 2) {
      pOut[lVar3] = pIn[lVar3 + 1] << 0x10 | (uint)(ushort)pIn[lVar3];
      pOut[lVar3 + 1] =
           CONCAT22(*(undefined2 *)((long)pIn + lVar3 * 4 + 6),
                    *(undefined2 *)((long)pIn + lVar3 * 4 + 2));
    }
    break;
  default:
    bVar1 = (char)Start - 5;
    uVar9 = 1 << (bVar1 & 0x1f);
    iVar11 = 2 << (bVar1 & 0x1f);
    iVar5 = 3 << (bVar1 & 0x1f);
    iVar4 = 4 << (bVar1 & 0x1f);
    iVar2 = 0;
    uVar8 = 0;
    if (0 < 1 << (bVar1 & 0x1f)) {
      uVar8 = (ulong)uVar9;
    }
    puVar10 = pIn + iVar11;
    puVar12 = pOut + (int)uVar9;
    puVar6 = pIn + (int)uVar9;
    puVar15 = pOut + iVar11;
    puVar16 = pIn + iVar5;
    puVar13 = pOut + iVar5;
    for (; iVar2 < (int)uVar7; iVar2 = iVar2 + iVar4) {
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        pOut[uVar14] = pIn[uVar14];
      }
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        puVar12[uVar14] = puVar10[uVar14];
      }
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        puVar15[uVar14] = puVar6[uVar14];
      }
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        puVar13[uVar14] = puVar16[uVar14];
      }
      pOut = pOut + iVar4;
      pIn = pIn + iVar4;
      puVar10 = puVar10 + iVar4;
      puVar12 = puVar12 + iVar4;
      puVar6 = puVar6 + iVar4;
      puVar15 = puVar15 + iVar4;
      puVar16 = puVar16 + iVar4;
      puVar13 = puVar13 + iVar4;
    }
  }
  return;
}

Assistant:

void Extra_TruthSwapAdjacentVars2( unsigned * pIn, unsigned * pOut, int nVars, int Start )
{
    int nWords = (nVars <= 5)? 1 : (1 << (nVars-5));
    int i, k, Step;

    assert( Start < nVars - 1 );
    switch ( Start )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x99999999) | ((pIn[i] & 0x22222222) << 1) | ((pIn[i] & 0x44444444) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xC3C3C3C3) | ((pIn[i] & 0x0C0C0C0C) << 2) | ((pIn[i] & 0x30303030) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xF00FF00F) | ((pIn[i] & 0x00F000F0) << 4) | ((pIn[i] & 0x0F000F00) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFF0000FF) | ((pIn[i] & 0x0000FF00) << 8) | ((pIn[i] & 0x00FF0000) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
        return;
    default:
        Step = (1 << (Start - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
        return;
    }
}